

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O3

int ldhsecret(lua_State *L)

{
  uint64_t uVar1;
  uint32_t y [2];
  uint32_t x [2];
  uint64_t local_20;
  ulong local_18;
  
  read64(L,(uint32_t *)&local_18,(uint32_t *)&local_20);
  if ((local_18 != 0) && (local_20 != 0)) {
    uVar1 = local_18 + 0x3b;
    if (local_18 < 0xffffffffffffffc6) {
      uVar1 = local_18;
    }
    uVar1 = pow_mod_p(uVar1,local_20);
    push64(L,uVar1);
    return 1;
  }
  luaL_error(L,"Can\'t be 0");
}

Assistant:

static int
ldhsecret(lua_State *L) {
	uint32_t x[2], y[2];
	read64(L, x, y);
	uint64_t xx = (uint64_t)x[0] | (uint64_t)x[1]<<32;
	uint64_t yy = (uint64_t)y[0] | (uint64_t)y[1]<<32;
	if (xx == 0 || yy == 0)
		return luaL_error(L, "Can't be 0");
	uint64_t r = powmodp(xx, yy);

	push64(L, r);

	return 1;
}